

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half_perf_test.cpp
# Opt level: O3

void perf_test_float_to_half(uint16_t *halfs,float *floats,int numentries)

{
  float fVar1;
  char cVar2;
  int64_t iVar3;
  ulong uVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  long lVar8;
  ushort uVar9;
  float fVar10;
  uint uVar11;
  long lVar12;
  
  iVar3 = get_ticks();
  if (0 < numentries) {
    uVar4 = 0;
    do {
      fVar1 = floats[uVar4];
      fVar10 = ABS(fVar1);
      uVar9 = (ushort)((uint)fVar1 >> 0x10) & 0x8000;
      if ((uint)fVar10 < 0x38800000) {
        if ((0x33000000 < (uint)fVar10) &&
           (uVar11 = (uint)fVar1 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar10 >> 0x17),
           uVar9 = uVar9 | (ushort)(uVar11 >> (0x7eU - cVar2 & 0x1f)),
           0x80000000 < uVar11 << (cVar2 + 0xa2U & 0x1f))) {
          uVar9 = uVar9 + 1;
        }
      }
      else if ((uint)fVar10 < 0x7f800000) {
        if ((uint)fVar10 < 0x477ff000) {
          uVar9 = (ushort)((int)fVar10 + 0x8000fffU + (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd)
                  | uVar9;
        }
        else {
          uVar9 = uVar9 | 0x7c00;
        }
      }
      else {
        uVar9 = uVar9 | 0x7c00;
        if (fVar10 != INFINITY) {
          uVar11 = (uint)fVar10 >> 0xd & 0x3ff;
          uVar9 = uVar9 | (ushort)uVar11 | (ushort)(uVar11 == 0);
        }
      }
      halfs[uVar4] = uVar9;
      uVar4 = uVar4 + 1;
    } while ((uint)numentries != uVar4);
  }
  iVar5 = get_ticks();
  iVar6 = get_ticks();
  if (0 < numentries) {
    uVar4 = 0;
    do {
      fVar1 = floats[uVar4];
      fVar10 = ABS(fVar1);
      uVar9 = (ushort)((uint)fVar1 >> 0x10) & 0x8000;
      if ((uint)fVar10 < 0x38800000) {
        if ((0x33000000 < (uint)fVar10) &&
           (uVar11 = (uint)fVar1 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar10 >> 0x17),
           uVar9 = uVar9 | (ushort)(uVar11 >> (0x7eU - cVar2 & 0x1f)),
           0x80000000 < uVar11 << (cVar2 + 0xa2U & 0x1f))) {
          uVar9 = uVar9 + 1;
        }
      }
      else if ((uint)fVar10 < 0x7f800000) {
        if ((uint)fVar10 < 0x477ff000) {
          uVar9 = (ushort)((int)fVar10 + 0x8000fffU + (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd)
                  | uVar9;
        }
        else {
          uVar9 = uVar9 | 0x7c00;
        }
      }
      else {
        uVar9 = uVar9 | 0x7c00;
        if (fVar10 != INFINITY) {
          uVar11 = (uint)fVar10 >> 0xd & 0x3ff;
          uVar9 = uVar9 | (ushort)uVar11 | (ushort)(uVar11 == 0);
        }
      }
      halfs[uVar4] = uVar9;
      uVar4 = uVar4 + 1;
    } while ((uint)numentries != uVar4);
  }
  iVar7 = get_ticks();
  lVar8 = iVar7 - iVar6;
  lVar12 = iVar5 - iVar3;
  fprintf(_stderr,"float -> half Old: %10lld (%g ns) New: %10lld (%g ns) (%10lld)\n",
          (double)lVar8 / (double)numentries,(double)lVar12 / (double)numentries,lVar8,lVar12,
          lVar8 - lVar12);
  return;
}

Assistant:

void
perf_test_float_to_half (uint16_t* halfs, const float* floats, int numentries)
{
    half* halfvals = reinterpret_cast<half*> (halfs);

    int64_t st = get_ticks ();
    for (int i = 0; i < numentries; ++i)
        halfs[i] = imath_float_to_half (floats[i]);
    int64_t et = get_ticks ();

    int64_t ost = get_ticks ();
    for (int i = 0; i < numentries; ++i)
        halfvals[i] = exptable_half_constructor (floats[i]);
    int64_t oet = get_ticks ();

    int64_t onanos = (oet - ost);
    int64_t nnanos = (et - st);
    fprintf (
        stderr,
        "float -> half Old: %10lld (%g ns) New: %10lld (%g ns) (%10lld)\n",
        (long long) onanos,
        (double) onanos / ((double) numentries),
        (long long) nnanos,
        (double) nnanos / ((double) numentries),
        ((long long) (onanos - nnanos)));
}